

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

Interval * __thiscall
vkt::shaderexecutor::FloatFunc3::applyPoint
          (Interval *__return_storage_ptr__,FloatFunc3 *this,EvalContext *ctx,double x,double y,
          double z)

{
  undefined1 auVar1 [12];
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  Interval local_48;
  Interval local_30;
  uint uVar11;
  
  dVar4 = (double)(**(code **)(*(long *)this + 0x60))(this);
  auVar10._0_8_ = (double)(**(code **)(*(long *)this + 0x68))(dVar4,x,y,z,this,ctx);
  local_48.m_hasNaN = NAN(dVar4);
  if (local_48.m_hasNaN) {
    dVar5 = INFINITY;
    local_48.m_lo = INFINITY;
    if (!local_48.m_hasNaN && !NAN(dVar4)) goto LAB_0087c50a;
  }
  else {
    local_48.m_lo = dVar4;
    dVar5 = dVar4;
    if (!local_48.m_hasNaN) goto LAB_0087c50a;
  }
  dVar4 = -INFINITY;
  local_48.m_lo = dVar5;
LAB_0087c50a:
  local_30.m_hasNaN = NAN(auVar10._0_8_);
  uVar11 = (uint)((long)((ulong)(uint)local_30.m_hasNaN << 0x3f) >> 0x3f);
  auVar1._4_8_ = 0;
  auVar1._0_4_ = uVar11;
  auVar9._0_12_ = auVar1 << 0x20;
  auVar9._12_4_ = (int)((long)((ulong)(uint)local_30.m_hasNaN << 0x3f) >> 0x3f);
  auVar12._4_4_ = uVar11;
  auVar12._0_4_ = uVar11;
  auVar12._8_4_ = auVar9._12_4_;
  auVar12._12_4_ = auVar9._12_4_;
  auVar10._8_8_ = -auVar10._0_8_;
  auVar6 = _DAT_009b3830 & auVar9 | ~auVar12 & auVar10;
  auVar10 = auVar9 & _DAT_009f6260 | ~auVar12 & auVar10;
  auVar8._0_8_ = auVar10._8_8_;
  auVar8._8_4_ = auVar10._0_4_;
  auVar8._12_4_ = auVar10._4_4_;
  dVar5 = auVar6._0_8_;
  dVar7 = auVar6._8_8_;
  uVar2 = -(ulong)(auVar8._0_8_ <= dVar5);
  uVar3 = -(ulong)(auVar8._8_8_ <= dVar7);
  local_30.m_lo = (double)(~uVar2 & (ulong)dVar5 | (ulong)auVar8._0_8_ & uVar2);
  local_30.m_hi = (double)(~uVar3 & auVar10._0_8_ | (ulong)dVar7 & uVar3);
  local_48.m_hi = dVar4;
  tcu::operator+(__return_storage_ptr__,&local_48,&local_30);
  return __return_storage_ptr__;
}

Assistant:

virtual Interval	applyPoint		(const EvalContext&	ctx,
										 double				x,
										 double				y,
										 double				z) const
	{
		const double exact	= this->applyExact(x, y, z);
		const double prec	= this->precision(ctx, exact, x, y, z);
		return exact + Interval(-prec, prec);
	}